

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonPal.h
# Opt level: O0

void TryFinally<Js::ScriptContext::DebugProfileProbeThunk(Js::RecyclableObject*,Js::CallInfo,___)::__0,Js::ScriptContext::DebugProfileProbeThunk(Js::RecyclableObject*,Js::CallInfo,___)::__1>
               (anon_class_40_5_f2a56c01 *tryFunc,anon_class_24_3_520fdb02 *finallyFunc)

{
  undefined1 local_28 [8];
  FinallyObject finallyObject;
  anon_class_24_3_520fdb02 *finallyFunc_local;
  anon_class_40_5_f2a56c01 *tryFunc_local;
  
  finallyObject._8_8_ = finallyFunc;
  TryFinally<Js::ScriptContext::DebugProfileProbeThunk(Js::RecyclableObject*,Js::CallInfo,...)::
  $_0,Js::ScriptContext::DebugProfileProbeThunk(Js::RecyclableObject*,Js::CallInfo,...)::$_1>(Js::
  ScriptContext::DebugProfileProbeThunk(Js::RecyclableObject*,Js::CallInfo,...)::$_0_const&,Js::
  ScriptContext::DebugProfileProbeThunk(Js::RecyclableObject*,Js::CallInfo,...)::$_1_const&)::
  FinallyObject::FinallyObject(Js::ScriptContext::
  DebugProfileProbeThunk(Js::RecyclableObject*,Js::CallInfo,...)::__1_const__(local_28,finallyFunc);
  Js::ScriptContext::DebugProfileProbeThunk::anon_class_40_5_f2a56c01::operator()(tryFunc);
  TryFinally<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp:4635:9),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp:4703:9)>
  ::FinallyObject::SetHasNoAbnormalTermination((FinallyObject *)local_28);
  TryFinally<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp:4635:9),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp:4703:9)>
  ::FinallyObject::~FinallyObject((FinallyObject *)local_28);
  return;
}

Assistant:

void TryFinally(const TryFunc& tryFunc, const FinallyFunc& finallyFunc)
{
    class FinallyObject
    {
    public:
        FinallyObject(const FinallyFunc& finallyFunc) : finallyFunc(finallyFunc), abnormalTermination(true) {}
        ~FinallyObject() { finallyFunc(abnormalTermination); }

        void SetHasNoAbnormalTermination() { abnormalTermination = false; }
    private:
        const FinallyFunc& finallyFunc;
        bool abnormalTermination;
    } finallyObject(finallyFunc);

    tryFunc();
    finallyObject.SetHasNoAbnormalTermination();
}